

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O0

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)

{
  undefined2 local_16;
  undefined4 local_14;
  uint16_t ms_byte;
  uint32_t ls_byte;
  uint32_t timeout_mclks_local;
  
  local_16 = 0;
  if (timeout_mclks == 0) {
    ls_byte._2_2_ = 0;
  }
  else {
    for (local_14 = timeout_mclks - 1; (local_14 & 0xffffff00) != 0; local_14 = local_14 >> 1) {
      local_16 = local_16 + 1;
    }
    ls_byte._2_2_ = local_16 << 8 | (ushort)local_14 & 0xff;
  }
  return ls_byte._2_2_;
}

Assistant:

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)
{
  // encoded format: "(LSByte * 2^MSByte) + 1"

  uint32_t ls_byte = 0;
  uint16_t ms_byte = 0;

  if (timeout_mclks > 0)
  {
    ls_byte = timeout_mclks - 1;

    while ((ls_byte & 0xFFFFFF00) > 0)
    {
      ls_byte >>= 1;
      ms_byte++;
    }

    return (ms_byte << 8) | (ls_byte & 0xFF);
  }
  else { return 0; }
}